

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

uintwide_t<256U,_unsigned_int,_void,_true> * __thiscall
math::wide_integer::uintwide_t<256U,_unsigned_int,_void,_true>::operator/=
          (uintwide_t<256U,_unsigned_int,_void,_true> *this,
          uintwide_t<256U,_unsigned_int,_void,_true> *other)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  long lVar4;
  local_unsigned_wide_type a;
  local_unsigned_wide_type b;
  
  if (this == other) {
    (this->values).super_array<unsigned_int,_8UL>.elems[0] = 1;
    for (lVar4 = 4; lVar4 != 0x20; lVar4 = lVar4 + 4) {
      *(undefined4 *)((long)(this->values).super_array<unsigned_int,_8UL>.elems + lVar4) = 0;
    }
  }
  else {
    bVar3 = is_zero(other);
    if (bVar3) {
      limits_helper_max<true>();
    }
    else {
      uVar1 = (this->values).super_array<unsigned_int,_8UL>.elems[7];
      uVar2 = (other->values).super_array<unsigned_int,_8UL>.elems[7];
      if (-1 < (int)(uVar2 | uVar1)) {
        eval_divide_knuth(this,other,(uintwide_t<256U,_unsigned_int,_void,_true> *)0x0);
        return this;
      }
      a.values.super_array<unsigned_int,_8UL>.elems._0_8_ =
           *(undefined8 *)(this->values).super_array<unsigned_int,_8UL>.elems;
      a.values.super_array<unsigned_int,_8UL>.elems._8_8_ =
           *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 2);
      a.values.super_array<unsigned_int,_8UL>.elems._16_8_ =
           *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 4);
      a.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
           *(undefined8 *)((this->values).super_array<unsigned_int,_8UL>.elems + 6);
      b.values.super_array<unsigned_int,_8UL>.elems._0_8_ =
           *(undefined8 *)(other->values).super_array<unsigned_int,_8UL>.elems;
      b.values.super_array<unsigned_int,_8UL>.elems._8_8_ =
           *(undefined8 *)((other->values).super_array<unsigned_int,_8UL>.elems + 2);
      b.values.super_array<unsigned_int,_8UL>.elems._16_8_ =
           *(undefined8 *)((other->values).super_array<unsigned_int,_8UL>.elems + 4);
      b.values.super_array<unsigned_int,_8UL>.elems._24_8_ =
           *(undefined8 *)((other->values).super_array<unsigned_int,_8UL>.elems + 6);
      if ((int)uVar1 < 0) {
        uintwide_t<256U,_unsigned_int,_void,_false>::negate(&a);
      }
      if ((int)uVar2 < 0) {
        uintwide_t<256U,_unsigned_int,_void,_false>::negate(&b);
      }
      uintwide_t<256U,_unsigned_int,_void,_false>::eval_divide_knuth
                (&a,&b,(uintwide_t<256U,_unsigned_int,_void,_false> *)0x0);
      if ((int)uVar1 < 0 != (int)uVar2 < 0) {
        uintwide_t<256U,_unsigned_int,_void,_false>::negate(&a);
      }
    }
    (this->values).super_array<unsigned_int,_8UL>.elems[4] =
         a.values.super_array<unsigned_int,_8UL>.elems[4];
    (this->values).super_array<unsigned_int,_8UL>.elems[5] =
         a.values.super_array<unsigned_int,_8UL>.elems[5];
    (this->values).super_array<unsigned_int,_8UL>.elems[6] =
         a.values.super_array<unsigned_int,_8UL>.elems[6];
    (this->values).super_array<unsigned_int,_8UL>.elems[7] =
         a.values.super_array<unsigned_int,_8UL>.elems[7];
    (this->values).super_array<unsigned_int,_8UL>.elems[0] =
         a.values.super_array<unsigned_int,_8UL>.elems[0];
    (this->values).super_array<unsigned_int,_8UL>.elems[1] =
         a.values.super_array<unsigned_int,_8UL>.elems[1];
    (this->values).super_array<unsigned_int,_8UL>.elems[2] =
         a.values.super_array<unsigned_int,_8UL>.elems[2];
    (this->values).super_array<unsigned_int,_8UL>.elems[3] =
         a.values.super_array<unsigned_int,_8UL>.elems[3];
  }
  return this;
}

Assistant:

constexpr auto operator/=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        values.front() = static_cast<limb_type>(UINT8_C(1));

        detail::fill_unsafe(detail::advance_and_point(values.begin(), 1U), values.end(), static_cast<limb_type>(UINT8_C(0))); // LCOV_EXCL_LINE
      }
      else if(other.is_zero())
      {
        static_cast<void>(operator=(limits_helper_max<IsSigned>()));
      }
      else
      {
        // Unary division function.

        const auto numer_was_neg = is_neg(*this);
        const auto denom_was_neg = is_neg(other);

        if(numer_was_neg || denom_was_neg)
        {
          using local_unsigned_wide_type = uintwide_t<Width2, limb_type, AllocatorType, false>;

          local_unsigned_wide_type a(*this);
          local_unsigned_wide_type b(other);

          if(numer_was_neg) { a.negate(); }
          if(denom_was_neg) { b.negate(); }

          a.eval_divide_knuth(b);

          if(numer_was_neg != denom_was_neg) { a.negate(); }

          values = a.values;
        }
        else
        {
          eval_divide_knuth(other);
        }
      }

      return *this;
    }